

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildWithDepsLogTestObsoleteDeps::Run(BuildWithDepsLogTestObsoleteDeps *this)

{
  Test *pTVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  LoadStatus LVar7;
  TimeStamp TVar8;
  Node *pNVar9;
  size_type sVar10;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  undefined1 local_6f8 [8];
  Builder builder_1;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  undefined1 local_5d0 [8];
  DepsLog deps_log_1;
  int fail_count_3;
  int fail_count_2;
  State state_1;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  undefined1 local_368 [8];
  Builder builder;
  string local_288;
  undefined1 local_268 [8];
  DepsLog deps_log;
  int fail_count_1;
  undefined1 local_1f0 [4];
  int fail_count;
  State state;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *manifest;
  string err;
  BuildWithDepsLogTestObsoleteDeps *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&manifest);
  local_38 = "build out: cat in1\n  deps = gcc\n  depfile = in1.d\n";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in1",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"in1.d",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"out: ",
             (allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  State::State((State *)local_1f0);
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)local_1f0);
  iVar6 = testing::Test::AssertionFailures(g_current_test);
  if (iVar5 == iVar6) {
    iVar5 = testing::Test::AssertionFailures(g_current_test);
    pcVar2 = local_38;
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)
               ((long)&deps_log.deps_.
                       super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 4));
    AssertParse((State *)local_1f0,pcVar2,stack0xfffffffffffffdfc);
    iVar6 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar6) {
      DepsLog::DepsLog((DepsLog *)local_268);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"ninja_deps",
                 (allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
      bVar4 = DepsLog::OpenForWrite((DepsLog *)local_268,&local_288,(string *)&manifest);
      bVar4 = testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x890,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
      pTVar1 = g_current_test;
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,bVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x891,"\"\" == err");
        if (bVar4) {
          Builder::Builder((Builder *)local_368,(State *)local_1f0,
                           &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                           (BuildLog *)0x0,(DepsLog *)local_268,
                           &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                            super_DiskInterface);
          std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                    ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                     &builder.plan_.command_edges_,
                     &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                      super_CommandRunner);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"out",&local_389);
          pNVar9 = Builder::AddTarget((Builder *)local_368,&local_388,(string *)&manifest);
          testing::Test::Check
                    (pTVar1,pNVar9 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x895,"builder.AddTarget(\"out\", &err)");
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator(&local_389);
          pTVar1 = g_current_test;
          bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&manifest);
          bVar4 = testing::Test::Check
                            (pTVar1,bVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x896,"\"\" == err");
          pTVar1 = g_current_test;
          if (bVar4) {
            bVar3 = Builder::Build((Builder *)local_368,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x897,"builder.Build(&err)");
            pTVar1 = g_current_test;
            bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x898,"\"\" == err");
            DepsLog::Close((DepsLog *)local_268);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder.plan_.command_edges_);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
          bVar4 = !bVar4;
          Builder::~Builder((Builder *)local_368);
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          bVar4 = true;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        bVar4 = true;
      }
      DepsLog::~DepsLog((DepsLog *)local_268);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      bVar4 = true;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    bVar4 = true;
  }
  State::~State((State *)local_1f0);
  if (!bVar4) {
    VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"in1",&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_3d9);
    VirtualFileSystem::Create
              (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_3b0,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"out",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"",&local_429);
    VirtualFileSystem::Create
              (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_400,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"in1.d",
               (allocator<char> *)
               ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    TVar8 = VirtualFileSystem::Stat
                      (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_450,
                       (string *)&manifest);
    testing::Test::Check
              (pTVar1,TVar8 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x8a5,"0 == fs_.Stat(\"in1.d\", &err)");
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    State::State((State *)&fail_count_3);
    iVar5 = testing::Test::AssertionFailures(g_current_test);
    StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)&fail_count_3);
    iVar6 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar6) {
      iVar5 = testing::Test::AssertionFailures(g_current_test);
      pcVar2 = local_38;
      ManifestParserOptions::ManifestParserOptions
                ((ManifestParserOptions *)
                 &deps_log_1.deps_.
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      AssertParse((State *)&fail_count_3,pcVar2,
                  (ManifestParserOptions)
                  deps_log_1.deps_.
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      iVar6 = testing::Test::AssertionFailures(g_current_test);
      if (iVar5 == iVar6) {
        DepsLog::DepsLog((DepsLog *)local_5d0);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,"ninja_deps",&local_5f1);
        LVar7 = DepsLog::Load((DepsLog *)local_5d0,&local_5f0,(State *)&fail_count_3,
                              (string *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,LVar7 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8ad,"deps_log.Load(\"ninja_deps\", &state, &err)");
        std::__cxx11::string::~string((string *)&local_5f0);
        std::allocator<char>::~allocator(&local_5f1);
        pTVar1 = g_current_test;
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_618,"ninja_deps",
                     (allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          bVar4 = DepsLog::OpenForWrite((DepsLog *)local_5d0,&local_618,(string *)&manifest);
          bVar4 = testing::Test::Check
                            (pTVar1,bVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x8ae,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          std::__cxx11::string::~string((string *)&local_618);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          if (((bVar4 ^ 0xffU) & 1) == 0) {
            Builder::Builder((Builder *)local_6f8,(State *)&fail_count_3,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                             (BuildLog *)0x0,(DepsLog *)local_5d0,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                              super_DiskInterface);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder_1.plan_.command_edges_,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        super_CommandRunner);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                     commands_ran_);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_718,"out",&local_719);
            pNVar9 = Builder::AddTarget((Builder *)local_6f8,&local_718,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,pNVar9 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x8b3,"builder.AddTarget(\"out\", &err)");
            std::__cxx11::string::~string((string *)&local_718);
            std::allocator<char>::~allocator(&local_719);
            pTVar1 = g_current_test;
            bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            bVar4 = testing::Test::Check
                              (pTVar1,bVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x8b4,"\"\" == err");
            if (bVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_740,"in1.d",&local_741);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_768,"out: ",&local_769);
              VirtualFileSystem::Create
                        (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_740,
                         &local_768);
              std::__cxx11::string::~string((string *)&local_768);
              std::allocator<char>::~allocator(&local_769);
              std::__cxx11::string::~string((string *)&local_740);
              std::allocator<char>::~allocator(&local_741);
              pTVar1 = g_current_test;
              bVar4 = Builder::Build((Builder *)local_6f8,(string *)&manifest);
              testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8b9,"builder.Build(&err)");
              pTVar1 = g_current_test;
              bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&manifest);
              testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8ba,"\"\" == err");
              pTVar1 = g_current_test;
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_);
              testing::Test::Check
                        (pTVar1,sVar10 == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8be,"1u == command_runner_.commands_ran_.size()");
              std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                        ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                         &builder_1.plan_.command_edges_);
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
            }
            Builder::~Builder((Builder *)local_6f8);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
        DepsLog::~DepsLog((DepsLog *)local_5d0);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    State::~State((State *)&fail_count_3);
  }
  std::__cxx11::string::~string((string *)&manifest);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, ObsoleteDeps) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    // Run an ordinary build that gathers dependencies.
    fs_.Create("in1", "");
    fs_.Create("in1.d", "out: ");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  // Push all files one tick forward so that only the deps are out
  // of date.
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("out", "");

  // The deps file should have been removed, so no need to timestamp it.
  EXPECT_EQ(0, fs_.Stat("in1.d", &err));

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);

    // Recreate the deps file here because the build expects them to exist.
    fs_.Create("in1.d", "out: ");

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to the deps being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}